

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O2

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,CMethod *stm)

{
  undefined8 uVar1;
  undefined8 uVar2;
  string *this_00;
  initializer_list<INode_*> __l;
  allocator_type local_e9;
  _Vector_base<INode_*,_std::allocator<INode_*>_> local_e8;
  string local_d0;
  string local_b0;
  vector<INode_*,_std::allocator<INode_*>_> children;
  ChildrenAnswers answers;
  ChildrenAnswers local_48;
  
  answers.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(stm->returnType)._M_t.super___uniq_ptr_impl<CType,_std::default_delete<CType>_>.
                _M_t.super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
                super__Head_base<0UL,_CType_*,_false>._M_head_impl;
  answers.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(stm->returnExp)._M_t.
                super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
                super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
                super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  answers.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(stm->arguments)._M_t.
                super___uniq_ptr_impl<CArgumentList,_std::default_delete<CArgumentList>_>._M_t.
                super__Tuple_impl<0UL,_CArgumentList_*,_std::default_delete<CArgumentList>_>.
                super__Head_base<0UL,_CArgumentList_*,_false>._M_head_impl;
  uVar1 = stm->statements;
  uVar2 = stm->vars;
  answers.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = (int)uVar1;
  answers.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = uVar2;
  answers.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._4_4_ = (int)((ulong)uVar1 >> 0x20);
  __l._M_len = 5;
  __l._M_array = (iterator)&answers;
  std::vector<INode_*,_std::allocator<INode_*>_>::vector(&children,__l,&local_e9);
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)&local_e8,&children);
  VisitChildren(&answers,this,(vector<INode_*,_std::allocator<INode_*>_> *)&local_e8);
  std::_Vector_base<INode_*,_std::allocator<INode_*>_>::~_Vector_base(&local_e8);
  ChildrenAnswers::ChildrenAnswers(&local_48,&answers);
  AddChildrenAnswers(this,(ChildrenAnswers *)&local_48);
  ChildrenAnswers::~ChildrenAnswers(&local_48);
  if (stm->isPublic == true) {
    std::__cxx11::string::string((string *)&local_b0,"PublicMethod",(allocator *)&local_e9);
    AddLabel(this,&local_b0);
    this_00 = &local_b0;
  }
  else {
    std::__cxx11::string::string((string *)&local_d0,"PrivateMethod",(allocator *)&local_e9);
    AddLabel(this,&local_d0);
    this_00 = &local_d0;
  }
  std::__cxx11::string::~string((string *)this_00);
  this->lastVisited = this->lastVisited + 1;
  ChildrenAnswers::~ChildrenAnswers((ChildrenAnswers *)&answers);
  std::_Vector_base<INode_*,_std::allocator<INode_*>_>::~_Vector_base
            (&children.super__Vector_base<INode_*,_std::allocator<INode_*>_>);
  return;
}

Assistant:

void CPrintVisitor::Visit(CMethod &stm) {
	std::vector<INode*> children = { stm.returnType.get(), stm.returnExp.get(), stm.arguments.get(), stm.vars.get(), stm.statements.get() };
	ChildrenAnswers answers = VisitChildren(children);

	AddChildrenAnswers(answers);
	if (stm.isPublic) {
		AddLabel("PublicMethod");
	} else {
		AddLabel("PrivateMethod");
	}
	++lastVisited;
}